

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O2

vector<lsp::types::Location,_std::allocator<lsp::types::Location>_> * __thiscall
lsp::XmlParser::getReferences
          (vector<lsp::types::Location,_std::allocator<lsp::types::Location>_>
           *__return_storage_ptr__,XmlParser *this,ReferenceParams *params)

{
  ReferenceElement *pRVar1;
  _List_node_base *this_00;
  uint32_t fileIndex;
  uint32_t uVar2;
  ShortnameElement *pSVar3;
  ReferenceElement **ref;
  pointer ppRVar4;
  shared_ptr<lsp::ArxmlStorage> storage;
  uint32_t offset;
  Location res;
  ShortnameElement elem;
  XmlParser local_1a8;
  _Vector_base<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>
  local_190;
  value_type local_178 [2];
  string local_110;
  string local_f0 [32];
  string local_d0;
  ShortnameElement local_b0;
  
  (__return_storage_ptr__->
  super__Vector_base<lsp::types::Location,_std::allocator<lsp::types::Location>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<lsp::types::Location,_std::allocator<lsp::types::Location>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<lsp::types::Location,_std::allocator<lsp::types::Location>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string(local_f0,(string *)params);
  getStorageForUri(&local_1a8,(DocumentUri *)this);
  std::__cxx11::string::~string(local_f0);
  this_00 = local_1a8.storages_.
            super__List_base<lsp::XmlParser::StorageElement,_std::allocator<lsp::XmlParser::StorageElement>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::string::string((string *)&local_110,(string *)params);
  fileIndex = ArxmlStorage::getFileIndex((ArxmlStorage *)this_00,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  uVar2 = ArxmlStorage::getOffsetFromPosition
                    ((ArxmlStorage *)
                     local_1a8.storages_.
                     super__List_base<lsp::XmlParser::StorageElement,_std::allocator<lsp::XmlParser::StorageElement>_>
                     ._M_impl._M_node.super__List_node_base._M_next,&params->position,fileIndex);
  local_b0.name._M_dataplus._M_p = (pointer)&local_b0.name.field_2;
  local_b0.name._M_string_length = 0;
  local_1a8.storages_.
  super__List_base<lsp::XmlParser::StorageElement,_std::allocator<lsp::XmlParser::StorageElement>_>.
  _M_impl._M_node._M_size._4_4_ = uVar2 + 2;
  local_b0.name.field_2._M_local_buf[0] = '\0';
  local_b0.path._M_dataplus._M_p = (pointer)&local_b0.path.field_2;
  local_b0.path._M_string_length = 0;
  local_b0.path.field_2._M_local_buf[0] = '\0';
  local_b0.children.
  super__Vector_base<const_lsp::ShortnameElement_*,_std::allocator<const_lsp::ShortnameElement_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0.children.
  super__Vector_base<const_lsp::ShortnameElement_*,_std::allocator<const_lsp::ShortnameElement_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0.children.
  super__Vector_base<const_lsp::ShortnameElement_*,_std::allocator<const_lsp::ShortnameElement_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0.references.
  super__Vector_base<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0.references.
  super__Vector_base<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0.references.
  super__Vector_base<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar3 = ArxmlStorage::getShortnameByOffset
                     ((ArxmlStorage *)
                      local_1a8.storages_.
                      super__List_base<lsp::XmlParser::StorageElement,_std::allocator<lsp::XmlParser::StorageElement>_>
                      ._M_impl._M_node.super__List_node_base._M_next,
                      (uint32_t *)
                      ((long)&local_1a8.storages_.
                              super__List_base<lsp::XmlParser::StorageElement,_std::allocator<lsp::XmlParser::StorageElement>_>
                              ._M_impl._M_node._M_size + 4),fileIndex);
  ShortnameElement::operator=(&local_b0,pSVar3);
  if (config::referenceLinkToParentShortname == '\x01') {
    ArxmlStorage::getReferencesByShortname
              ((vector<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>
                *)&local_190,
               (ArxmlStorage *)
               local_1a8.storages_.
               super__List_base<lsp::XmlParser::StorageElement,_std::allocator<lsp::XmlParser::StorageElement>_>
               ._M_impl._M_node.super__List_node_base._M_next,&local_b0);
    for (ppRVar4 = local_190._M_impl.super__Vector_impl_data._M_start;
        ppRVar4 != local_190._M_impl.super__Vector_impl_data._M_finish; ppRVar4 = ppRVar4 + 1) {
      local_178[0].uri._M_string_length = 0;
      local_178[0].uri.field_2._M_local_buf[0] = '\0';
      local_178[0].uri._M_dataplus._M_p = (pointer)&local_178[0].uri.field_2;
      ArxmlStorage::getUriFromFileIndex_abi_cxx11_
                (&local_d0,
                 (ArxmlStorage *)
                 local_1a8.storages_.
                 super__List_base<lsp::XmlParser::StorageElement,_std::allocator<lsp::XmlParser::StorageElement>_>
                 ._M_impl._M_node.super__List_node_base._M_next,(*ppRVar4)->fileIndex);
      std::__cxx11::string::operator=((string *)local_178,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      local_178[0].range.start =
           ArxmlStorage::getPositionFromOffset
                     ((ArxmlStorage *)
                      local_1a8.storages_.
                      super__List_base<lsp::XmlParser::StorageElement,_std::allocator<lsp::XmlParser::StorageElement>_>
                      ._M_impl._M_node.super__List_node_base._M_next,
                      (*ppRVar4)->owner->charOffset - 1,(*ppRVar4)->owner->fileIndex);
      pSVar3 = (*ppRVar4)->owner;
      local_178[0].range.end =
           ArxmlStorage::getPositionFromOffset
                     ((ArxmlStorage *)
                      local_1a8.storages_.
                      super__List_base<lsp::XmlParser::StorageElement,_std::allocator<lsp::XmlParser::StorageElement>_>
                      ._M_impl._M_node.super__List_node_base._M_next,
                      (pSVar3->charOffset + (int)(pSVar3->name)._M_string_length) - 1,
                      pSVar3->fileIndex);
      std::vector<lsp::types::Location,_std::allocator<lsp::types::Location>_>::push_back
                (__return_storage_ptr__,local_178);
      std::__cxx11::string::~string((string *)local_178);
    }
  }
  else {
    ArxmlStorage::getReferencesByShortname
              ((vector<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>
                *)&local_190,
               (ArxmlStorage *)
               local_1a8.storages_.
               super__List_base<lsp::XmlParser::StorageElement,_std::allocator<lsp::XmlParser::StorageElement>_>
               ._M_impl._M_node.super__List_node_base._M_next,&local_b0);
    for (; local_190._M_impl.super__Vector_impl_data._M_start !=
           local_190._M_impl.super__Vector_impl_data._M_finish;
        local_190._M_impl.super__Vector_impl_data._M_start =
             local_190._M_impl.super__Vector_impl_data._M_start + 1) {
      local_178[0].uri._M_string_length = 0;
      local_178[0].uri.field_2._M_local_buf[0] = '\0';
      local_178[0].uri._M_dataplus._M_p = (pointer)&local_178[0].uri.field_2;
      ArxmlStorage::getUriFromFileIndex_abi_cxx11_
                (&local_d0,
                 (ArxmlStorage *)
                 local_1a8.storages_.
                 super__List_base<lsp::XmlParser::StorageElement,_std::allocator<lsp::XmlParser::StorageElement>_>
                 ._M_impl._M_node.super__List_node_base._M_next,
                 (*local_190._M_impl.super__Vector_impl_data._M_start)->fileIndex);
      std::__cxx11::string::operator=((string *)local_178,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      local_178[0].range.start =
           ArxmlStorage::getPositionFromOffset
                     ((ArxmlStorage *)
                      local_1a8.storages_.
                      super__List_base<lsp::XmlParser::StorageElement,_std::allocator<lsp::XmlParser::StorageElement>_>
                      ._M_impl._M_node.super__List_node_base._M_next,
                      (*local_190._M_impl.super__Vector_impl_data._M_start)->charOffset - 2,
                      (*local_190._M_impl.super__Vector_impl_data._M_start)->fileIndex);
      pRVar1 = *local_190._M_impl.super__Vector_impl_data._M_start;
      local_178[0].range.end =
           ArxmlStorage::getPositionFromOffset
                     ((ArxmlStorage *)
                      local_1a8.storages_.
                      super__List_base<lsp::XmlParser::StorageElement,_std::allocator<lsp::XmlParser::StorageElement>_>
                      ._M_impl._M_node.super__List_node_base._M_next,
                      (pRVar1->charOffset + (int)(pRVar1->targetPath)._M_string_length) - 1,
                      pRVar1->fileIndex);
      std::vector<lsp::types::Location,_std::allocator<lsp::types::Location>_>::push_back
                (__return_storage_ptr__,local_178);
      std::__cxx11::string::~string((string *)local_178);
    }
  }
  std::_Vector_base<const_lsp::ReferenceElement_*,_std::allocator<const_lsp::ReferenceElement_*>_>::
  ~_Vector_base(&local_190);
  ShortnameElement::~ShortnameElement(&local_b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&local_1a8.storages_.
                     super__List_base<lsp::XmlParser::StorageElement,_std::allocator<lsp::XmlParser::StorageElement>_>
                     ._M_impl._M_node.super__List_node_base + 8));
  return __return_storage_ptr__;
}

Assistant:

std::vector<lsp::types::Location> lsp::XmlParser::getReferences(const lsp::types::ReferenceParams &params)
{
    std::vector<lsp::types::Location> results;
    
    auto storage = getStorageForUri(params.textDocument.uri);
    uint32_t fileIndex = storage->getFileIndex(params.textDocument.uri);
    uint32_t offset = storage->getOffsetFromPosition(params.position, fileIndex) + 2;
    lsp::ShortnameElement elem;
    try
    {
        elem = storage->getShortnameByOffset(offset, fileIndex);
    }
    catch(const lsp::elementNotFoundException& e)
    {
        auto reference = storage->getReferenceByOffset(offset, fileIndex);
        elem = helper_getShortnameFromInnerPath(storage, reference, offset);
    }

    if(lsp::config::referenceLinkToParentShortname)
    {
        for(auto &ref: storage->getReferencesByShortname(elem))
        {
            lsp::types::Location res;
            res.uri = storage->getUriFromFileIndex(ref->fileIndex);
            res.range.start = storage->getPositionFromOffset(ref->owner->charOffset - 1, ref->owner->fileIndex);
            res.range.end = storage->getPositionFromOffset(ref->owner->charOffset + ref->owner->name.length() - 1, ref->owner->fileIndex);
            results.push_back(res);
        }
    }
    else
    {
        for(auto &ref: storage->getReferencesByShortname(elem))
        {
            lsp::types::Location res;
            res.uri = storage->getUriFromFileIndex(ref->fileIndex);
            res.range.start = storage->getPositionFromOffset(ref->charOffset - 2, ref->fileIndex);
            res.range.end = storage->getPositionFromOffset(ref->charOffset + ref->targetPath.length() - 1, ref->fileIndex);
            results.push_back(res);
        }
    }
    return results;
}